

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall
trompeloeil::
list<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::delete_disposer>
::~list(list<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::delete_disposer>
        *this)

{
  bool bVar1;
  condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *t;
  condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *elem;
  iterator local_18;
  iterator i;
  list<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::delete_disposer>
  *this_local;
  
  (this->
  super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  )._vptr_list_elem = (_func_int **)&PTR__list_007c6e50;
  i.p = &this->
         super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ;
  local_18 = begin(this);
  while( true ) {
    elem = (condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            *)end(this);
    bVar1 = trompeloeil::operator!=(&local_18,(iterator *)&elem);
    if (!bVar1) break;
    t = iterator::operator*(&local_18);
    iterator::operator++(&local_18);
    delete_disposer::dispose<trompeloeil::condition_base<bool(float,std::__cxx11::string_const&)>>
              ((delete_disposer *)this,t);
  }
  list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ::~list_elem(&this->
                super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
              );
  return;
}

Assistant:

list<T, Disposer>::~list()
  {
    auto i = this->begin();
    while (i != this->end())
    {
      auto& elem = *i;
      ++i; // intrusive list, so advance before destroying
      Disposer::dispose(&elem);
    }
  }